

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_lex.c
# Opt level: O0

yajl_tok yajl_lex_utf8_char(yajl_lexer lexer,uchar *jsonText,size_t jsonTextLen,size_t *offset,
                           uchar curChar)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  uchar *puVar5;
  ulong *in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  byte in_R8B;
  uint local_7c;
  uint local_6c;
  uint local_4c;
  
  if (in_R8B < 0x80) {
    return yajl_tok_string;
  }
  if ((int)(uint)in_R8B >> 5 == 6) {
    if (in_RDX <= *in_RCX) {
      return yajl_tok_eof;
    }
    if (((*(int *)(in_RDI + 0x28) == 0) ||
        (sVar4 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)), sVar4 == 0)) ||
       (uVar2 = *(ulong *)(in_RDI + 0x20), sVar4 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)),
       sVar4 <= uVar2)) {
      uVar2 = *in_RCX;
      *in_RCX = uVar2 + 1;
      bVar1 = *(byte *)(in_RSI + uVar2);
    }
    else {
      puVar5 = yajl_buf_data(*(yajl_buf *)(in_RDI + 0x18));
      lVar3 = *(long *)(in_RDI + 0x20);
      *(long *)(in_RDI + 0x20) = lVar3 + 1;
      bVar1 = puVar5[lVar3];
    }
    if ((int)(uint)bVar1 >> 6 == 2) {
      return yajl_tok_string;
    }
  }
  else if ((int)(uint)in_R8B >> 4 == 0xe) {
    if (in_RDX <= *in_RCX) {
      return yajl_tok_eof;
    }
    if (((*(int *)(in_RDI + 0x28) == 0) ||
        (sVar4 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)), sVar4 == 0)) ||
       (uVar2 = *(ulong *)(in_RDI + 0x20), sVar4 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)),
       sVar4 <= uVar2)) {
      uVar2 = *in_RCX;
      *in_RCX = uVar2 + 1;
      bVar1 = *(byte *)(in_RSI + uVar2);
    }
    else {
      puVar5 = yajl_buf_data(*(yajl_buf *)(in_RDI + 0x18));
      lVar3 = *(long *)(in_RDI + 0x20);
      *(long *)(in_RDI + 0x20) = lVar3 + 1;
      bVar1 = puVar5[lVar3];
    }
    local_4c = (uint)bVar1;
    if ((int)local_4c >> 6 == 2) {
      if (in_RDX <= *in_RCX) {
        return yajl_tok_eof;
      }
      if (((*(int *)(in_RDI + 0x28) == 0) ||
          (sVar4 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)), sVar4 == 0)) ||
         (uVar2 = *(ulong *)(in_RDI + 0x20), sVar4 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)),
         sVar4 <= uVar2)) {
        uVar2 = *in_RCX;
        *in_RCX = uVar2 + 1;
        bVar1 = *(byte *)(in_RSI + uVar2);
      }
      else {
        puVar5 = yajl_buf_data(*(yajl_buf *)(in_RDI + 0x18));
        lVar3 = *(long *)(in_RDI + 0x20);
        *(long *)(in_RDI + 0x20) = lVar3 + 1;
        bVar1 = puVar5[lVar3];
      }
      if ((int)(uint)bVar1 >> 6 == 2) {
        return yajl_tok_string;
      }
    }
  }
  else if ((int)(uint)in_R8B >> 3 == 0x1e) {
    if (in_RDX <= *in_RCX) {
      return yajl_tok_eof;
    }
    if (((*(int *)(in_RDI + 0x28) == 0) ||
        (sVar4 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)), sVar4 == 0)) ||
       (uVar2 = *(ulong *)(in_RDI + 0x20), sVar4 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)),
       sVar4 <= uVar2)) {
      uVar2 = *in_RCX;
      *in_RCX = uVar2 + 1;
      bVar1 = *(byte *)(in_RSI + uVar2);
    }
    else {
      puVar5 = yajl_buf_data(*(yajl_buf *)(in_RDI + 0x18));
      lVar3 = *(long *)(in_RDI + 0x20);
      *(long *)(in_RDI + 0x20) = lVar3 + 1;
      bVar1 = puVar5[lVar3];
    }
    local_6c = (uint)bVar1;
    if ((int)local_6c >> 6 == 2) {
      if (in_RDX <= *in_RCX) {
        return yajl_tok_eof;
      }
      if (((*(int *)(in_RDI + 0x28) == 0) ||
          (sVar4 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)), sVar4 == 0)) ||
         (uVar2 = *(ulong *)(in_RDI + 0x20), sVar4 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)),
         sVar4 <= uVar2)) {
        uVar2 = *in_RCX;
        *in_RCX = uVar2 + 1;
        bVar1 = *(byte *)(in_RSI + uVar2);
      }
      else {
        puVar5 = yajl_buf_data(*(yajl_buf *)(in_RDI + 0x18));
        lVar3 = *(long *)(in_RDI + 0x20);
        *(long *)(in_RDI + 0x20) = lVar3 + 1;
        bVar1 = puVar5[lVar3];
      }
      local_7c = (uint)bVar1;
      if ((int)local_7c >> 6 == 2) {
        if (in_RDX <= *in_RCX) {
          return yajl_tok_eof;
        }
        if (((*(int *)(in_RDI + 0x28) == 0) ||
            (sVar4 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)), sVar4 == 0)) ||
           (uVar2 = *(ulong *)(in_RDI + 0x20), sVar4 = yajl_buf_len(*(yajl_buf *)(in_RDI + 0x18)),
           sVar4 <= uVar2)) {
          uVar2 = *in_RCX;
          *in_RCX = uVar2 + 1;
          bVar1 = *(byte *)(in_RSI + uVar2);
        }
        else {
          puVar5 = yajl_buf_data(*(yajl_buf *)(in_RDI + 0x18));
          lVar3 = *(long *)(in_RDI + 0x20);
          *(long *)(in_RDI + 0x20) = lVar3 + 1;
          bVar1 = puVar5[lVar3];
        }
        if ((int)(uint)bVar1 >> 6 == 2) {
          return yajl_tok_string;
        }
      }
    }
  }
  return yajl_tok_error;
}

Assistant:

static yajl_tok
yajl_lex_utf8_char(yajl_lexer lexer, const unsigned char * jsonText,
                   size_t jsonTextLen, size_t * offset,
                   unsigned char curChar)
{
    if (curChar <= 0x7f) {
        /* single byte */
        return yajl_tok_string;
    } else if ((curChar >> 5) == 0x6) {
        /* two byte */
        UTF8_CHECK_EOF;
        curChar = readChar(lexer, jsonText, offset);
        if ((curChar >> 6) == 0x2) return yajl_tok_string;
    } else if ((curChar >> 4) == 0x0e) {
        /* three byte */
        UTF8_CHECK_EOF;
        curChar = readChar(lexer, jsonText, offset);
        if ((curChar >> 6) == 0x2) {
            UTF8_CHECK_EOF;
            curChar = readChar(lexer, jsonText, offset);
            if ((curChar >> 6) == 0x2) return yajl_tok_string;
        }
    } else if ((curChar >> 3) == 0x1e) {
        /* four byte */
        UTF8_CHECK_EOF;
        curChar = readChar(lexer, jsonText, offset);
        if ((curChar >> 6) == 0x2) {
            UTF8_CHECK_EOF;
            curChar = readChar(lexer, jsonText, offset);
            if ((curChar >> 6) == 0x2) {
                UTF8_CHECK_EOF;
                curChar = readChar(lexer, jsonText, offset);
                if ((curChar >> 6) == 0x2) return yajl_tok_string;
            }
        }
    }

    return yajl_tok_error;
}